

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_registry.h
# Opt level: O1

Results * __thiscall
testinator::TestRegistry::RunSuite
          (Results *__return_storage_ptr__,TestRegistry *this,string *suiteName,RunParams *params,
          Outputter *outputter)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  mapped_type *pmVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>
  _Var4;
  Outputter *outputter_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  pVar5;
  TestMap localMap;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>
  local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pVar5 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
          ::equal_range(&(this->m_testsBySuite)._M_t,suiteName);
  _Var4 = pVar5.first._M_node;
  if (_Var4._M_node != pVar5.second._M_node._M_node) {
    paVar1 = &local_88.first.field_2;
    do {
      pmVar3 = ::std::
               map<testinator::Test_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<testinator::Test_*>,_std::allocator<std::pair<testinator::Test_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->m_testNames,(key_type *)(_Var4._M_node + 2));
      pcVar2 = (pmVar3->_M_dataplus)._M_p;
      local_88.first._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + pmVar3->_M_string_length);
      local_88.second = *(Test **)(_Var4._M_node + 2);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,testinator::Test*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,testinator::Test*>,std::_Select1st<std::pair<std::__cxx11::string_const,testinator::Test*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,testinator::Test*>>>
                  *)&local_60,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_88.first._M_dataplus._M_p,
                        local_88.first.field_2._M_allocated_capacity + 1);
      }
      _Var4._M_node = (_Base_ptr)::std::_Rb_tree_increment(_Var4._M_node);
    } while (_Var4._M_node != pVar5.second._M_node._M_node);
  }
  outputter_00 = outputter;
  if (outputter == (Outputter *)0x0) {
    outputter_00 = (Outputter *)operator_new(8);
    outputter_00->_vptr_Outputter = (_func_int **)&PTR_startRun_0016a718;
  }
  RunTests(__return_storage_ptr__,this,(TestMap *)&local_60,params,outputter_00);
  if (outputter_00 != (Outputter *)0x0 && outputter == (Outputter *)0x0) {
    (*outputter_00->_vptr_Outputter[8])(outputter_00);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testinator::Test_*>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Results RunSuite(const std::string& suiteName,
                     const RunParams& params = RunParams(),
                     const Outputter* outputter = nullptr)
    {
      TestMap localMap;
      auto range = m_testsBySuite.equal_range(suiteName);
      for (auto& i = range.first; i != range.second; ++i)
      {
        localMap.insert({m_testNames[i->second], i->second});
      }
      return RunTests(
          localMap,
          params,
          outputter != nullptr ? outputter : std::make_unique<Outputter>().get());
    }